

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleSetDifferentialMatrix(int instance,int matrixIndex,double *inMatrix)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0x90))
                      (pBVar2,matrixIndex,inMatrix,*(code **)(*(long *)pBVar2 + 0x90));
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleSetDifferentialMatrix(int instance,
                                int matrixIndex,
                                const double* inMatrix) {
    DEBUG_START_TIME();

    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->setDifferentialMatrix(matrixIndex, inMatrix);
    DEBUG_END_TIME();
    return returnValue;
}